

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
           *this)

{
  ulong uVar1;
  size_t sVar2;
  
  if (this->capacity_ == 0) {
    sVar2 = 1;
  }
  else {
    uVar1 = this->size_;
    sVar2 = CapacityToGrowth(this->capacity_);
    if (uVar1 <= sVar2 >> 1) {
      drop_deletes_without_resize(this);
      return;
    }
    sVar2 = this->capacity_ * 2 + 1;
  }
  resize(this,sVar2);
  return;
}

Assistant:

void rehash_and_grow_if_necessary()
			{
				if (capacity_ == 0) {
					resize(1);
				}
				else if (size() <= CapacityToGrowth(capacity()) / 2) {
					// Squash DELETED without growing if there is enough capacity.
					drop_deletes_without_resize();
				}
				else {
					// Otherwise grow the container.
					resize(capacity_ * 2 + 1);
				}
			}